

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseTryTableCatches(WastParser *this,TryTableVector *catches)

{
  char **__return_storage_ptr__;
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  TokenTypePair pair;
  undefined1 local_180 [8];
  Token token;
  undefined1 local_120 [8];
  TableCatch catch_;
  TryTableVector *catches_local;
  WastParser *this_local;
  
  do {
    pair = PeekPair(this);
    bVar1 = anon_unknown_1::IsTryTableCatch(pair);
    if (!bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    Consume((Token *)&catch_.kind,this);
    __return_storage_ptr__ = &token.field_2.literal_.text._M_str;
    GetLocation((Location *)__return_storage_ptr__,this);
    TableCatch::TableCatch((TableCatch *)local_120,(Location *)__return_storage_ptr__);
    Consume((Token *)local_180,this);
    TVar2 = Token::token_type((Token *)local_180);
    switch(TVar2) {
    case Catch:
      catch_.target.field_2._24_4_ = 0;
      break;
    case CatchAll:
      catch_.target.field_2._24_4_ = 2;
      break;
    case CatchRef:
      catch_.target.field_2._24_4_ = 1;
      break;
    case CatchAllRef:
      catch_.target.field_2._24_4_ = 3;
      break;
    default:
      abort();
    }
    if ((catch_.target.field_2._24_4_ == 0) || (catch_.target.field_2._24_4_ == 1)) {
      RVar3 = ParseVar(this,(Var *)((long)&catch_.loc.field_1 + 8));
      bVar1 = Failed(RVar3);
      if (!bVar1) goto LAB_001b1723;
      Result::Result((Result *)((long)&this_local + 4),Error);
      bVar1 = true;
    }
    else {
LAB_001b1723:
      RVar3 = ParseVar(this,(Var *)((long)&catch_.tag.field_2 + 0x18));
      bVar1 = Failed(RVar3);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        bVar1 = true;
      }
      else {
        RVar3 = Expect(this,Rpar);
        bVar1 = Failed(RVar3);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
        else {
          std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::push_back
                    (catches,(value_type *)local_120);
          bVar1 = false;
        }
      }
    }
    TableCatch::~TableCatch((TableCatch *)local_120);
    if (bVar1) {
      return (Result)this_local._4_4_;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseTryTableCatches(TryTableVector* catches) {
  WABT_TRACE(ParseTryTableCatches);

  while (IsTryTableCatch(PeekPair())) {
    Consume();
    TableCatch catch_(GetLocation());
    auto token = Consume();
    switch (token.token_type()) {
      case TokenType::Catch:
        catch_.kind = CatchKind::Catch;
        break;
      case TokenType::CatchRef:
        catch_.kind = CatchKind::CatchRef;
        break;
      case TokenType::CatchAll:
        catch_.kind = CatchKind::CatchAll;
        break;
      case TokenType::CatchAllRef:
        catch_.kind = CatchKind::CatchAllRef;
        break;
      default:
        WABT_UNREACHABLE;
    }
    if (catch_.kind == CatchKind::Catch || catch_.kind == CatchKind::CatchRef) {
      CHECK_RESULT(ParseVar(&catch_.tag));
    }
    CHECK_RESULT(ParseVar(&catch_.target));
    EXPECT(Rpar);
    catches->push_back(std::move(catch_));
  }

  return Result::Ok;
}